

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O1

void __thiscall lexer_exception::~lexer_exception(lexer_exception *this)

{
  ~lexer_exception(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~lexer_exception() throw() { }